

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O3

void __thiscall wallet::InternalPage::Unserialize<AutoFile>(InternalPage *this,AutoFile *s)

{
  iterator __position;
  runtime_error *this_00;
  size_t in_RCX;
  uint uVar1;
  size_t nSize;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  InternalRecord record;
  RecordHeader rec_hdr;
  uint16_t index;
  InternalRecord local_68;
  RecordHeader local_40;
  unsigned_short local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_header).entries != 0) {
    uVar1 = 0;
    lVar4 = 0x10;
    lVar2 = -0x1c;
    do {
      AutoFile::read(s,(int)&local_68,(void *)0x2,in_RCX);
      local_3a = local_68.m_header.len;
      if ((this->m_header).other_endian == true) {
        local_3a = local_68.m_header.len << 8 | local_68.m_header.len >> 8;
      }
      __position._M_current =
           (this->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->indexes,
                   __position,&local_3a);
      }
      else {
        *__position._M_current = local_3a;
        (this->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar3 = (ulong)local_3a;
      nSize = lVar2 + uVar3;
      if ((long)nSize < 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Internal record position not in page");
LAB_001e31bf:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001e3232;
      }
      AutoFile::ignore(s,nSize);
      local_40.other_endian = (this->m_header).other_endian;
      RecordHeader::Unserialize<AutoFile>(&local_40,s);
      if (local_40.type != KEYDATA) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unknown record type in internal page");
        goto LAB_001e31bf;
      }
      local_68.m_header.other_endian = local_40.other_endian;
      local_68.m_header._5_1_ = local_40._5_1_;
      local_68.m_header.len = local_40.len;
      local_68.m_header.type = local_40.type;
      local_68.m_header.deleted = local_40.deleted;
      local_68.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      InternalRecord::Unserialize<AutoFile>(&local_68,s);
      std::vector<wallet::InternalRecord,std::allocator<wallet::InternalRecord>>::
      emplace_back<wallet::InternalRecord&>
                ((vector<wallet::InternalRecord,std::allocator<wallet::InternalRecord>> *)
                 &this->records,&local_68);
      AutoFile::seek(s,lVar4 - (uVar3 + local_40.len),1);
      if (local_68.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.data.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.data.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar1 = uVar1 + 1;
      lVar4 = lVar4 + 2;
      lVar2 = lVar2 + -2;
    } while (uVar1 < (this->m_header).entries);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001e3232:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        // Current position within the page
        int64_t pos = PageHeader::SIZE;

        // Get the items
        for (uint32_t i = 0; i < m_header.entries; ++i) {
            // Get the index
            uint16_t index;
            s >> index;
            if (m_header.other_endian) {
                index = internal_bswap_16(index);
            }
            indexes.push_back(index);
            pos += sizeof(uint16_t);

            // Go to the offset from the index
            int64_t to_jump = index - pos;
            if (to_jump < 0) {
                throw std::runtime_error("Internal record position not in page");
            }
            s.ignore(to_jump);

            // Read the record
            RecordHeader rec_hdr(m_header.other_endian);
            s >> rec_hdr;
            to_jump += RecordHeader::SIZE;

            if (rec_hdr.type != RecordType::KEYDATA) {
                throw std::runtime_error("Unknown record type in internal page");
            }
            InternalRecord record(rec_hdr);
            s >> record;
            records.emplace_back(record);
            to_jump += InternalRecord::FIXED_SIZE + rec_hdr.len;

            // Go back to the indexes
            s.seek(-to_jump, SEEK_CUR);
        }
    }